

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void Arguments_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_48 [8];
  JsValue v;
  JsAstArgumentsArg *arg;
  JsAstArgumentsNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  n = (JsAstArgumentsNode *)res;
  for (v.u.reference.name = (char *)na[1].location; v.u.reference.name != (char *)0x0;
      v.u._8_8_ = v.u.reference.name[8]) {
    (*JsNodeClassEval[**(uint **)v.u.reference.name])
              (*(JsAstNode **)v.u.reference.name,context,(JsValue *)local_48);
    JsGetValue((JsValue *)local_48,(JsValue *)n);
    n = (JsAstArgumentsNode *)&n->first;
  }
  return;
}

Assistant:

static void
Arguments_eval(na, context, res)
	struct JsAstNode *na; /* (struct Arguments_node) */
	struct JsContext *context;
	struct JsValue *res;		/* Assumed pointer to array */
{
	struct JsAstArgumentsNode *n = CAST_NODE(na, JsAstArgumentsNode);
	struct JsAstArgumentsArg *arg;
	struct JsValue v;

	for (arg = n->first; arg; arg = arg->next) {
		EVAL(arg->expr, context, &v);
		JsGetValue( &v, res);
		res++;
	}
}